

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

pair<QPDFObjectHandle,_bool> *
QPDFParser::parse(pair<QPDFObjectHandle,_bool> *__return_storage_ptr__,InputSource *input,
                 string *object_description,Tokenizer *tokenizer,StringDecrypter *decrypter,
                 QPDF *context)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_108 [16];
  QPDFParser local_f8;
  undefined1 local_50 [8];
  QPDFObjectHandle result;
  bool empty;
  QPDF *context_local;
  StringDecrypter *decrypter_local;
  Tokenizer *tokenizer_local;
  string *object_description_local;
  InputSource *input_local;
  
  result.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._7_1_ = 0;
  iVar1 = (*input->_vptr_InputSource[3])();
  make_description((QPDFParser *)local_108,(string *)CONCAT44(extraout_var,iVar1),object_description
                  );
  QPDFParser((QPDFParser *)(local_108 + 0x10),input,
             (shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
              *)local_108,object_description,tokenizer,decrypter,context,true,0,0);
  parse((QPDFParser *)local_50,(bool *)(local_108 + 0x10),
        (bool)((char)&result.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
              '\a'));
  ~QPDFParser((QPDFParser *)(local_108 + 0x10));
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::~shared_ptr((shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
                 *)local_108);
  std::pair<QPDFObjectHandle,_bool>::pair<QPDFObjectHandle_&,_bool_&,_true>
            (__return_storage_ptr__,(QPDFObjectHandle *)local_50,
             (bool *)((long)&result.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::pair<QPDFObjectHandle, bool>
QPDFParser::parse(
    InputSource& input,
    std::string const& object_description,
    qpdf::Tokenizer& tokenizer,
    QPDFObjectHandle::StringDecrypter* decrypter,
    QPDF& context)
{
    bool empty{false};
    auto result = QPDFParser(
                      input,
                      make_description(input.getName(), object_description),
                      object_description,
                      tokenizer,
                      decrypter,
                      &context,
                      true)
                      .parse(empty, false);
    return {result, empty};
}